

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_math.cpp
# Opt level: O0

double getExpection(TRIPLERGB **mrx,int h,int w,int component,int y,int x)

{
  byte bVar1;
  undefined4 local_38;
  undefined4 local_34;
  int j;
  int i;
  double count;
  int x_local;
  int y_local;
  int component_local;
  int w_local;
  int h_local;
  TRIPLERGB **mrx_local;
  
  _j = 0.0;
  for (local_34 = y; local_38 = x, local_34 < h; local_34 = local_34 + 1) {
    for (; local_38 < w; local_38 = local_38 + 1) {
      bVar1 = getComponent((TRIPLEBYTES **)mrx,local_34,local_38,component);
      _j = (double)bVar1 + _j;
    }
  }
  return _j / (double)((h - y) * (w - x));
}

Assistant:

double getExpection(TRIPLERGB **mrx, int h, int w, int component, int y, int x) {
    double count = 0;
    for (int i = y; i < h; i++) {
        for (int j = x; j < w; j++) {
            count += getComponent((TRIPLEBYTES **) mrx, i, j, component);
        }
    }
    return (count / ((h - y) * (w - x)));
}